

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O0

ssize_t tnt_io_send_raw(tnt_stream_net *s,char *buf,size_t size,int all)

{
  int *piVar1;
  bool bVar2;
  long local_40;
  ssize_t r;
  size_t off;
  int all_local;
  size_t size_local;
  char *buf_local;
  tnt_stream_net *s_local;
  
  r = 0;
  while( true ) {
    if ((s->sbuf).tx == (tnt_iob_tx_t)0x0) {
      do {
        local_40 = send(s->fd,buf + r,size - r,0);
        bVar2 = false;
        if (local_40 == -1) {
          piVar1 = __errno_location();
          bVar2 = *piVar1 == 4;
        }
      } while (bVar2);
    }
    else {
      local_40 = (*(s->sbuf).tx)(&s->sbuf,buf + r,size - r);
    }
    if (local_40 < 1) break;
    r = local_40 + r;
    if (r == size || all == 0) {
      return r;
    }
  }
  s->error = TNT_ESYSTEM;
  piVar1 = __errno_location();
  s->errno_ = *piVar1;
  return -1;
}

Assistant:

ssize_t
tnt_io_send_raw(struct tnt_stream_net *s, const char *buf, size_t size, int all)
{
	size_t off = 0;
	do {
		ssize_t r;
		if (s->sbuf.tx) {
			r = s->sbuf.tx(&s->sbuf, buf + off, size - off);
		} else {
			do {
				r = send(s->fd, buf + off, size - off, 0);
			} while (r == -1 && (errno == EINTR));
		}
		if (r <= 0) {
			s->error = TNT_ESYSTEM;
			s->errno_ = errno;
			return -1;
		}
		off += r;
	} while (off != size && all);
	return off;
}